

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O2

vec2 __thiscall CGameClient::GetCharPos(CGameClient *this,int ClientID,bool Predicted)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  CCharacterInfo *pCVar6;
  undefined3 in_register_00000011;
  vec2 vVar7;
  vec2 vVar8;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar9;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar10;
  
  if (CONCAT31(in_register_00000011,Predicted) != 0) {
    vVar8 = this->m_aClients[ClientID].m_Predicted.m_Pos;
    vVar7 = this->m_aClients[ClientID].m_PrevPredicted.m_Pos;
    aVar9 = vVar7.field_0;
    aVar10 = vVar7.field_1;
    fVar1 = this->m_pClient->m_PredIntraTick;
    vVar7.field_0.x = fVar1 * (vVar8.field_0.x - aVar9.x) + aVar9.x;
    vVar7.field_1.y = fVar1 * (vVar8.field_1.y - aVar10.y) + aVar10.y;
    return vVar7;
  }
  pCVar6 = (this->m_Snap).m_aCharacters + ClientID;
  uVar2 = (pCVar6->m_Prev).super_CNetObj_CharacterCore.m_X;
  uVar4 = (pCVar6->m_Prev).super_CNetObj_CharacterCore.m_Y;
  pCVar6 = (this->m_Snap).m_aCharacters + ClientID;
  uVar3 = (pCVar6->m_Cur).super_CNetObj_CharacterCore.m_X;
  uVar5 = (pCVar6->m_Cur).super_CNetObj_CharacterCore.m_Y;
  fVar1 = this->m_pClient->m_GameIntraTick;
  vVar8.field_0.x = fVar1 * ((float)(int)uVar3 - (float)(int)uVar2) + (float)(int)uVar2;
  vVar8.field_1.y = fVar1 * ((float)(int)uVar5 - (float)(int)uVar4) + (float)(int)uVar4;
  return vVar8;
}

Assistant:

vec2 CGameClient::GetCharPos(int ClientID, bool Predicted) const
{
	if(Predicted)
	{
		return mix(
			m_aClients[ClientID].m_PrevPredicted.m_Pos,
			m_aClients[ClientID].m_Predicted.m_Pos,
			Client()->PredIntraGameTick()
		);
	}
	else
	{
		return mix(
			vec2(m_Snap.m_aCharacters[ClientID].m_Prev.m_X, m_Snap.m_aCharacters[ClientID].m_Prev.m_Y),
			vec2(m_Snap.m_aCharacters[ClientID].m_Cur.m_X, m_Snap.m_aCharacters[ClientID].m_Cur.m_Y),
			Client()->IntraGameTick()
		);
	}
}